

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::argument_loader<PairedReadsMapper_const&>::load_impl_sequence<0ul>
          (void *param_1,long param_2)

{
  initializer_list<bool> *this;
  const_iterator pbVar1;
  const_iterator pbVar2;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<bool> *__range3;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  handle in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffb0;
  bool local_31;
  initializer_list<bool> local_30;
  initializer_list<bool> *local_20;
  long local_18;
  void *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  this = (initializer_list<bool> *)
         std::get<0ul,pybind11::detail::type_caster<PairedReadsMapper,void>>
                   ((tuple<pybind11::detail::type_caster<PairedReadsMapper,_void>_> *)0x4050f8);
  std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
            ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),0);
  std::vector<bool,_std::allocator<bool>_>::operator[]
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffb0);
  local_31 = type_caster_generic::load
                       ((type_caster_generic *)
                        CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                        in_stack_ffffffffffffffa0,SUB81((ulong)this >> 0x38,0));
  local_30._M_array = &local_31;
  local_30._M_len = 1;
  local_20 = &local_30;
  pbVar1 = std::initializer_list<bool>::begin(local_20);
  pbVar2 = std::initializer_list<bool>::end(this);
  while( true ) {
    if (pbVar1 == pbVar2) {
      return true;
    }
    if ((*pbVar1 & 1U) == 0) break;
    pbVar1 = pbVar1 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }